

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O1

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::solveUpdateRight(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *this,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *vec)

{
  int iVar1;
  int iVar2;
  fpclass_type fVar3;
  pointer pnVar4;
  int *piVar5;
  int *piVar6;
  int *piVar7;
  int32_t iVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  cpp_dec_float<200U,_int,_void> *pcVar12;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar13;
  cpp_dec_float<200U,_int,_void> *pcVar14;
  cpp_dec_float<200U,_int,_void> *pcVar15;
  int iVar16;
  int *piVar17;
  byte bVar18;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<200U,_int,_void> local_138;
  cpp_dec_float<200U,_int,_void> local_b8;
  
  bVar18 = 0;
  local_b8.data._M_elems[0] = 0;
  local_b8.data._M_elems[1] = 0;
  local_b8.data._M_elems[2] = 0;
  local_b8.data._M_elems[3] = 0;
  local_b8.data._M_elems[4] = 0;
  local_b8.data._M_elems[5] = 0;
  local_b8.data._M_elems[6] = 0;
  local_b8.data._M_elems[7] = 0;
  local_b8.data._M_elems[8] = 0;
  local_b8.data._M_elems[9] = 0;
  local_b8.data._M_elems[10] = 0;
  local_b8.data._M_elems[0xb] = 0;
  local_b8.data._M_elems[0xc] = 0;
  local_b8.data._M_elems[0xd] = 0;
  local_b8.data._M_elems[0xe] = 0;
  local_b8.data._M_elems[0xf] = 0;
  local_b8.data._M_elems[0x10] = 0;
  local_b8.data._M_elems[0x11] = 0;
  local_b8.data._M_elems[0x12] = 0;
  local_b8.data._M_elems[0x13] = 0;
  local_b8.data._M_elems[0x14] = 0;
  local_b8.data._M_elems[0x15] = 0;
  local_b8.data._M_elems[0x16] = 0;
  local_b8.data._M_elems[0x17] = 0;
  local_b8.data._M_elems[0x18] = 0;
  local_b8.data._M_elems[0x19] = 0;
  local_b8.data._M_elems._104_5_ = 0;
  local_b8.data._M_elems[0x1b]._1_3_ = 0;
  iVar1 = (this->l).firstUnused;
  iVar9 = (this->l).firstUpdate;
  lVar10 = (long)iVar9;
  if (iVar9 < iVar1) {
    pnVar4 = (this->l).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    piVar5 = (this->l).idx;
    piVar6 = (this->l).row;
    piVar7 = (this->l).start;
    do {
      iVar9 = piVar6[lVar10];
      pnVar13 = vec + iVar9;
      pcVar12 = &local_b8;
      for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
        (pcVar12->data)._M_elems[0] = (pnVar13->m_backend).data._M_elems[0];
        pnVar13 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar13 + ((ulong)bVar18 * -2 + 1) * 4);
        pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + ((ulong)bVar18 * -2 + 1) * 4);
      }
      local_b8.exp = vec[iVar9].m_backend.exp;
      local_b8.neg = vec[iVar9].m_backend.neg;
      fVar3 = vec[iVar9].m_backend.fpclass;
      iVar8 = vec[iVar9].m_backend.prec_elem;
      local_b8.fpclass = fVar3;
      local_b8.prec_elem = iVar8;
      if (fVar3 == cpp_dec_float_NaN) {
LAB_0053d26e:
        iVar9 = piVar7[lVar10];
        iVar16 = piVar7[lVar10 + 1];
        if (iVar9 < iVar16) {
          pcVar12 = &pnVar4[iVar9].m_backend;
          piVar17 = piVar5 + iVar9;
          do {
            local_138.fpclass = cpp_dec_float_finite;
            local_138.prec_elem = 0x1c;
            local_138.data._M_elems[0] = 0;
            local_138.data._M_elems[1] = 0;
            local_138.data._M_elems[2] = 0;
            local_138.data._M_elems[3] = 0;
            local_138.data._M_elems[4] = 0;
            local_138.data._M_elems[5] = 0;
            local_138.data._M_elems[6] = 0;
            local_138.data._M_elems[7] = 0;
            local_138.data._M_elems[8] = 0;
            local_138.data._M_elems[9] = 0;
            local_138.data._M_elems[10] = 0;
            local_138.data._M_elems[0xb] = 0;
            local_138.data._M_elems[0xc] = 0;
            local_138.data._M_elems[0xd] = 0;
            local_138.data._M_elems[0xe] = 0;
            local_138.data._M_elems[0xf] = 0;
            local_138.data._M_elems[0x10] = 0;
            local_138.data._M_elems[0x11] = 0;
            local_138.data._M_elems[0x12] = 0;
            local_138.data._M_elems[0x13] = 0;
            local_138.data._M_elems[0x14] = 0;
            local_138.data._M_elems[0x15] = 0;
            local_138.data._M_elems[0x16] = 0;
            local_138.data._M_elems[0x17] = 0;
            local_138.data._M_elems[0x18] = 0;
            local_138.data._M_elems[0x19] = 0;
            local_138.data._M_elems._104_5_ = 0;
            local_138.data._M_elems[0x1b]._1_3_ = 0;
            local_138.exp = 0;
            local_138.neg = false;
            pcVar14 = &local_b8;
            if (pcVar12 != &local_138) {
              pcVar15 = &local_138;
              for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
                (pcVar15->data)._M_elems[0] = (pcVar14->data)._M_elems[0];
                pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + (ulong)bVar18 * -8 + 4)
                ;
                pcVar15 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar15 + (ulong)bVar18 * -8 + 4)
                ;
              }
              local_138.exp = local_b8.exp;
              local_138.neg = local_b8.neg;
              local_138.fpclass = local_b8.fpclass;
              local_138.prec_elem = local_b8.prec_elem;
              pcVar14 = pcVar12;
            }
            pcVar12 = pcVar12 + 1;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                      (&local_138,pcVar14);
            iVar2 = *piVar17;
            piVar17 = piVar17 + 1;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                      (&vec[iVar2].m_backend,&local_138);
            iVar16 = iVar16 + -1;
          } while (iVar9 < iVar16);
        }
      }
      else {
        local_138.fpclass = cpp_dec_float_finite;
        local_138.prec_elem = 0x1c;
        local_138.data._M_elems[0] = 0;
        local_138.data._M_elems[1] = 0;
        local_138.data._M_elems[2] = 0;
        local_138.data._M_elems[3] = 0;
        local_138.data._M_elems[4] = 0;
        local_138.data._M_elems[5] = 0;
        local_138.data._M_elems[6] = 0;
        local_138.data._M_elems[7] = 0;
        local_138.data._M_elems[8] = 0;
        local_138.data._M_elems[9] = 0;
        local_138.data._M_elems[10] = 0;
        local_138.data._M_elems[0xb] = 0;
        local_138.data._M_elems[0xc] = 0;
        local_138.data._M_elems[0xd] = 0;
        local_138.data._M_elems[0xe] = 0;
        local_138.data._M_elems[0xf] = 0;
        local_138.data._M_elems[0x10] = 0;
        local_138.data._M_elems[0x11] = 0;
        local_138.data._M_elems[0x12] = 0;
        local_138.data._M_elems[0x13] = 0;
        local_138.data._M_elems[0x14] = 0;
        local_138.data._M_elems[0x15] = 0;
        local_138.data._M_elems[0x16] = 0;
        local_138.data._M_elems[0x17] = 0;
        local_138.data._M_elems[0x18] = 0;
        local_138.data._M_elems[0x19] = 0;
        local_138.data._M_elems._104_5_ = 0;
        local_138.data._M_elems[0x1b]._1_3_ = 0;
        local_138.exp = 0;
        local_138.neg = false;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)&local_138,0.0);
        iVar9 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                          (&local_b8,&local_138);
        if (iVar9 != 0) goto LAB_0053d26e;
      }
      lVar10 = lVar10 + 1;
    } while (iVar1 != (int)lVar10);
  }
  return;
}

Assistant:

void CLUFactor<R>::solveUpdateRight(R* vec)
{
   int i, j, k;
   int end;
   R x;
   R* lval, *val;
   int* lrow, *lidx, *idx;
   int* lbeg;

   assert(!l.updateType);               /* no Forest-Tomlin Updates */

   lval = l.val.data();
   lidx = l.idx;
   lrow = l.row;
   lbeg = l.start;

   end = l.firstUnused;

   for(i = l.firstUpdate; i < end; ++i)
   {
      if((x = vec[lrow[i]]) != 0.0)
      {
         k = lbeg[i];
         idx = &(lidx[k]);
         val = &(lval[k]);

         for(j = lbeg[i + 1]; j > k; --j)
            vec[*idx++] -= x * (*val++);
      }
   }
}